

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O0

vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
* __thiscall
happly::Element::getDataFromListPropertyRecursive<unsigned_long,signed_char>
          (Element *this,Property *prop)

{
  bool bVar1;
  runtime_error *this_00;
  Element *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_RDI;
  TypeChain<signed_char> chainType;
  Tcan *v;
  iterator __end0;
  iterator __begin0;
  vector<signed_char,_std::allocator<signed_char>_> *__range4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> castedFlatVecCopy;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *castedFlatVec;
  TypedListProperty<signed_char> *castedProp;
  vector<signed_char,_std::allocator<signed_char>_> *in_stack_fffffffffffffe38;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  Property *local_1a8;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 uVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffee0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffee8;
  string local_b8 [39];
  TypeChain<signed_char> local_91 [25];
  long local_78;
  reference local_70;
  char *local_68;
  __normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_> local_60
  ;
  Property *local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_28;
  Element *pEVar3;
  
  pEVar3 = in_RDX;
  if (in_RDX == (Element *)0x0) {
    local_1a8 = (Property *)0x0;
  }
  else {
    local_1a8 = (Property *)
                __dynamic_cast(in_RDX,&Property::typeinfo,&TypedListProperty<signed_char>::typeinfo,
                               0);
  }
  if (local_1a8 == (Property *)0x0) {
    anon_unknown_3::TypeChain<signed_char>::TypeChain(local_91);
    if ((local_91[0].hasChildType & 1U) == 0) {
      uVar2 = 1;
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((char *)in_stack_fffffffffffffe88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar2,in_stack_fffffffffffffe80));
      std::operator+(in_stack_fffffffffffffe48,(char *)this_00);
      typeName<unsigned_long>();
      std::operator+(&in_RDX->name,in_RSI);
      std::operator+(in_stack_fffffffffffffe48,(char *)this_00);
      (**(code **)(*(long *)&pEVar3->name + 0x58))(&stack0xfffffffffffffe88);
      std::operator+(&in_RDX->name,in_RSI);
      std::runtime_error::runtime_error(this_00,local_b8);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    getDataFromListPropertyRecursive<unsigned_long,signed_char>(pEVar3,local_1a8);
  }
  else {
    local_28 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
    this_01 = &local_40;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x23c8b2);
    geometrycentral::surface::std::vector<signed_char,_std::allocator<signed_char>_>::size
              ((vector<signed_char,_std::allocator<signed_char>_> *)(local_1a8 + 1));
    geometrycentral::surface::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RSI,(size_type)in_RDI);
    local_58 = local_1a8 + 1;
    local_60._M_current =
         (char *)geometrycentral::surface::std::vector<signed_char,_std::allocator<signed_char>_>::
                 begin(in_stack_fffffffffffffe38);
    local_68 = (char *)geometrycentral::surface::std::
                       vector<signed_char,_std::allocator<signed_char>_>::end
                                 (in_stack_fffffffffffffe38);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                          *)in_stack_fffffffffffffe40,
                         (__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                          *)in_stack_fffffffffffffe38);
      if (!bVar1) break;
      local_70 = __gnu_cxx::
                 __normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                 ::operator*(&local_60);
      local_78 = (long)*local_70;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (in_stack_fffffffffffffe40,(value_type_conflict1 *)in_stack_fffffffffffffe38);
      __gnu_cxx::
      __normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>::
      operator++(&local_60);
    }
    local_28 = &local_40;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    anon_unknown_3::unflattenList<unsigned_long>
              (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this_01);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this_01);
  }
  return in_RDI;
}

Assistant:

std::vector<std::vector<D>> getDataFromListPropertyRecursive(Property* prop) {
    typedef typename CanonicalName<T>::type Tcan;

    TypedListProperty<Tcan>* castedProp = dynamic_cast<TypedListProperty<Tcan>*>(prop);
    if (castedProp) {
      // Succeeded, return a buffer of the data (copy while converting type)

      // Convert to flat buffer of new type
      std::vector<D>* castedFlatVec = nullptr;
      std::vector<D> castedFlatVecCopy; // we _might_ make a copy here, depending on is_same below

      if (std::is_same<std::vector<D>, std::vector<Tcan>>::value) {
        // just use the array we already have
        castedFlatVec = addressIfSame<std::vector<D>>(castedProp->flattenedData, 0 /* dummy arg to disambiguate */);
      } else {
        // make a copy
        castedFlatVecCopy.reserve(castedProp->flattenedData.size());
        for (Tcan& v : castedProp->flattenedData) {
          castedFlatVecCopy.push_back(static_cast<D>(v));
        }
        castedFlatVec = &castedFlatVecCopy;
      }

      // Unflatten and return
      return unflattenList(*castedFlatVec, castedProp->flattenedIndexStart);
    }

    TypeChain<Tcan> chainType;
    if (chainType.hasChildType) {
      return getDataFromListPropertyRecursive<D, typename TypeChain<Tcan>::type>(prop);
    } else {
      // No smaller type to try, failure
      throw std::runtime_error("PLY parser: list property " + prop->name +
                               " cannot be coerced to requested type list " + typeName<D>() + ". Has type list " +
                               prop->propertyTypeName());
    }
  }